

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Array<capnp::PipelineOp>_> * capnp::_::anon_unknown_0::toPipelineOps(Reader ops)

{
  ushort uVar1;
  ListElementCount LVar2;
  PipelineOp *pPVar3;
  ulong uVar4;
  long lVar5;
  ulong unaff_RBP;
  Maybe<kj::Array<capnp::PipelineOp>_> *in_RDI;
  ArrayBuilder<capnp::PipelineOp> result;
  Fault f;
  uint local_7c;
  IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
  local_78;
  Reader opReader;
  
  LVar2 = ops.reader.elementCount;
  uVar4 = (ulong)ops.reader.elementCount;
  result.pos = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::PipelineOp>(uVar4);
  result.endPtr = result.pos + uVar4;
  local_78.index = 0;
  result.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result.ptr = result.pos;
  local_78.container = &ops;
  do {
    pPVar3 = result.ptr;
    if (local_78.index == LVar2) {
      lVar5 = (long)result.pos - (long)result.ptr;
      opReader._reader.data = result.disposer;
      result.ptr = (PipelineOp *)0x0;
      result.pos = (RemoveConst<capnp::PipelineOp> *)0x0;
      result.endPtr = (PipelineOp *)0x0;
      (in_RDI->ptr).isSet = true;
      (in_RDI->ptr).field_1.value.ptr = pPVar3;
      (in_RDI->ptr).field_1.value.size_ = lVar5 >> 3;
      (in_RDI->ptr).field_1.value.disposer = result.disposer;
      opReader._reader.segment = (SegmentReader *)0x0;
      opReader._reader.capTable = (CapTableReader *)0x0;
      kj::Array<capnp::PipelineOp>::~Array((Array<capnp::PipelineOp> *)&opReader);
LAB_003f9f06:
      kj::ArrayBuilder<capnp::PipelineOp>::dispose(&result);
      return in_RDI;
    }
    IndexingIterator<const_capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>::Reader,_capnp::rpc::PromisedAnswer::Op::Reader>
    ::operator*(&opReader,&local_78);
    if (opReader._reader.dataSize < 0x10) {
      uVar4 = 0;
    }
    else {
      uVar1 = *opReader._reader.data;
      uVar4 = (ulong)uVar1;
      if (uVar1 != 0) {
        if (uVar1 != 1) {
          local_7c = (uint)uVar1;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x53,FAILED,(char *)0x0,"\"Unsupported pipeline op.\", (uint)opReader.which()"
                     ,(char (*) [25])"Unsupported pipeline op.",&local_7c);
          (in_RDI->ptr).isSet = false;
          kj::_::Debug::Fault::~Fault(&f);
          goto LAB_003f9f06;
        }
        uVar4 = 1;
        if (opReader._reader.dataSize < 0x20) {
          unaff_RBP = 0;
        }
        else {
          unaff_RBP = (ulong)*(ushort *)((long)opReader._reader.data + 2);
        }
      }
    }
    *result.pos = (RemoveConst<capnp::PipelineOp>)((unaff_RBP & 0xffff) << 0x20 | uVar4);
    result.pos = result.pos + 1;
    local_78.index = local_78.index + 1;
  } while( true );
}

Assistant:

kj::Maybe<kj::Array<PipelineOp>> toPipelineOps(List<rpc::PromisedAnswer::Op>::Reader ops) {
  auto result = kj::heapArrayBuilder<PipelineOp>(ops.size());
  for (auto opReader: ops) {
    PipelineOp op;
    switch (opReader.which()) {
      case rpc::PromisedAnswer::Op::NOOP:
        op.type = PipelineOp::NOOP;
        break;
      case rpc::PromisedAnswer::Op::GET_POINTER_FIELD:
        op.type = PipelineOp::GET_POINTER_FIELD;
        op.pointerIndex = opReader.getGetPointerField();
        break;
      default:
        KJ_FAIL_REQUIRE("Unsupported pipeline op.", (uint)opReader.which()) {
          return nullptr;
        }
    }
    result.add(op);
  }
  return result.finish();
}